

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskFileIndex.cpp
# Opt level: O2

void __thiscall
OnDiskFileIndex::OnDiskFileIndex
          (OnDiskFileIndex *this,path *db_base,string *files_fname,string *cache_fname)

{
  bool bVar1;
  ulong uVar2;
  path local_d0;
  path local_90;
  string local_50;
  
  std::experimental::filesystem::v1::__cxx11::path::path(&this->db_base,db_base);
  std::__cxx11::string::string((string *)&this->files_fname,(string *)files_fname);
  std::__cxx11::string::string((string *)&this->cache_fname,(string *)cache_fname);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_d0,files_fname)
  ;
  std::experimental::filesystem::v1::__cxx11::operator/(&local_90,db_base,&local_d0);
  std::__cxx11::string::string((string *)&local_50,(string *)&local_90);
  RawFile::RawFile(&this->files_file,&local_50,0,0);
  std::__cxx11::string::~string((string *)&local_50);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_90);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_d0);
  (this->cache_file).super__Optional_base<RawFile,_false,_false>._M_payload.
  super__Optional_payload<RawFile,_true,_false,_false>.super__Optional_payload_base<RawFile>.
  _M_engaged = false;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_d0,cache_fname)
  ;
  std::experimental::filesystem::v1::__cxx11::operator/(&local_90,db_base,&local_d0);
  bVar1 = std::experimental::filesystem::v1::exists(&local_90);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_90);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_d0);
  if (bVar1) {
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              (&local_d0,cache_fname);
    std::experimental::filesystem::v1::__cxx11::operator/(&local_90,db_base,&local_d0);
    uVar2 = std::experimental::filesystem::v1::file_size(&local_90);
    this->file_count = (uVar2 >> 3) - 1;
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_90);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_d0);
  }
  else {
    generate_namecache_file(this);
  }
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_d0,cache_fname)
  ;
  std::experimental::filesystem::v1::__cxx11::operator/(&local_90,db_base,&local_d0);
  std::optional<RawFile>::emplace<std::experimental::filesystem::v1::__cxx11::path>
            (&this->cache_file,&local_90);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_90);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_d0);
  return;
}

Assistant:

OnDiskFileIndex::OnDiskFileIndex(const fs::path &db_base,
                                 const std::string &files_fname,
                                 const std::string &cache_fname)
    : db_base(db_base),
      files_fname(files_fname),
      cache_fname(cache_fname),
      files_file(db_base / files_fname) {  // <- cool race condition here
    if (fs::exists(db_base / cache_fname)) {
        file_count = fs::file_size(db_base / cache_fname) / 8 - 1;
    } else {
        generate_namecache_file();
    }
    cache_file.emplace(db_base / cache_fname);
}